

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError TestParameters(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *parameters,
                      double sampleRate,StreamDirection streamDir)

{
  long lVar1;
  double sampleRate_00;
  snd_pcm_t *psVar2;
  int iVar3;
  int iVar4;
  snd_pcm_format_t sVar5;
  PaError PVar6;
  int iVar7;
  size_t __n;
  int *piVar8;
  PaSampleFormat availableFormats;
  PaSampleFormat PVar9;
  pthread_t __thread1;
  char *pcVar10;
  int *piVar11;
  int __pa_unsure_error_id;
  snd_pcm_hw_params_t *hwParams;
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [8];
  double local_40;
  snd_pcm_t *local_38;
  snd_pcm_t *pcm;
  
  local_38 = (snd_pcm_t *)0x0;
  uStack_50 = 0x10f9fe;
  local_40 = sampleRate;
  __n = snd_pcm_hw_params_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  hwParams = asStack_48 + lVar1;
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fa1c;
  memset(hwParams,0,__n);
  if (parameters->hostApiSpecificStreamInfo == (void *)0x0) {
    piVar11 = (int *)((long)&hostApi->deviceInfos[parameters->device][1].name +
                     (ulong)(streamDir != StreamDirection_In) * 4 + 4);
    piVar8 = &parameters->channelCount;
    if (parameters->channelCount <= *piVar11) {
      piVar8 = piVar11;
    }
  }
  else {
    piVar8 = &parameters->channelCount;
  }
  iVar4 = *piVar8;
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fa69;
  paUtilErr_ = AlsaOpen(hostApi,parameters,streamDir,&local_38);
  psVar2 = local_38;
  if (paUtilErr_ < 0) {
    pcVar10 = 
    "Expression \'AlsaOpen( hostApi, parameters, streamDir, &pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1767\n"
    ;
  }
  else {
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fa83;
    snd_pcm_hw_params_any(psVar2,hwParams);
    psVar2 = local_38;
    sampleRate_00 = local_40;
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fa94;
    iVar3 = SetApproximateSampleRate(psVar2,hwParams,sampleRate_00);
    psVar2 = local_38;
    if (iVar3 < 0) {
      PVar6 = -0x270d;
      goto LAB_0010fba8;
    }
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10faab;
    iVar4 = snd_pcm_hw_params_set_channels(psVar2,hwParams,iVar4);
    psVar2 = local_38;
    if (iVar4 < 0) {
      PVar6 = -0x270e;
      goto LAB_0010fba8;
    }
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fabc;
    availableFormats = GetAvailableFormats(psVar2);
    PVar9 = parameters->sampleFormat;
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fac8;
    PVar9 = PaUtil_SelectClosestAvailableFormat(availableFormats,PVar9);
    psVar2 = local_38;
    paUtilErr_ = (PaError)PVar9;
    if (-1 < paUtilErr_) {
      *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fae2;
      sVar5 = Pa2AlsaFormat(PVar9);
      *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10faef;
      iVar4 = snd_pcm_hw_params_set_format(psVar2,hwParams,sVar5);
      PVar6 = 0;
      iVar3 = 0;
      if (iVar4 < 0) {
        *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fbef;
        TestParameters_cold_1();
        iVar3 = 6;
        PVar6 = -9999;
      }
      psVar2 = local_38;
      if (iVar3 != 6) {
        if (iVar3 != 0) {
          return PVar6;
        }
        *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb1c;
        iVar4 = snd_pcm_hw_params(psVar2,hwParams);
        iVar3 = 0;
        if (iVar4 < 0) {
          iVar3 = 6;
          PVar6 = -0x2709;
          if (iVar4 != -0x16) {
            PVar6 = -0x2701;
            if (iVar4 != -0x10) {
              *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb4f;
              __thread1 = pthread_self();
              *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb61;
              iVar7 = pthread_equal(__thread1,paUnixMainThread);
              PVar6 = -9999;
              if (iVar7 != 0) {
                *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb6f;
                pcVar10 = (char *)snd_strerror(iVar4);
                *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb7f;
                PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar4,pcVar10);
              }
            }
            *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fb8d;
            PaUtil_DebugPrint(
                             "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1811\n"
                             );
          }
        }
        if ((iVar3 != 0) && (iVar3 != 6)) {
          return PVar6;
        }
      }
      goto LAB_0010fba8;
    }
    pcVar10 = 
    "Expression \'hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1785\n"
    ;
  }
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fbdf;
  PaUtil_DebugPrint(pcVar10);
  PVar6 = paUtilErr_;
LAB_0010fba8:
  if (local_38 != (snd_pcm_t *)0x0) {
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x10fbb6;
    snd_pcm_close();
  }
  return PVar6;
}

Assistant:

static PaError TestParameters( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *parameters,
        double sampleRate, StreamDirection streamDir )
{
    PaError result = paNoError;
    snd_pcm_t *pcm = NULL;
    PaSampleFormat availableFormats;
    /* We are able to adapt to a number of channels less than what the device supports */
    unsigned int numHostChannels;
    PaSampleFormat hostFormat;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    if( !parameters->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( hostApi, parameters->device );
        numHostChannels = PA_MAX( parameters->channelCount, StreamDirection_In == streamDir ?
                devInfo->minInputChannels : devInfo->minOutputChannels );
    }
    else
        numHostChannels = parameters->channelCount;

    PA_ENSURE( AlsaOpen( hostApi, parameters, streamDir, &pcm ) );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( SetApproximateSampleRate( pcm, hwParams, sampleRate ) < 0 )
    {
        result = paInvalidSampleRate;
        goto error;
    }

    if( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, numHostChannels ) < 0 )
    {
        result = paInvalidChannelCount;
        goto error;
    }

    /* See if we can find a best possible match */
    availableFormats = GetAvailableFormats( pcm );
    PA_ENSURE( hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat ) );

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) ), paUnanticipatedHostError );

    {
        /* It happens that this call fails because the device is busy */
        int ret = 0;
        if( ( ret = alsa_snd_pcm_hw_params( pcm, hwParams ) ) < 0 )
        {
            if( -EINVAL == ret )
            {
                /* Don't know what to return here */
                result = paBadIODeviceCombination;
                goto error;
            }
            else if( -EBUSY == ret )
            {
                result = paDeviceUnavailable;
                PA_DEBUG(( "%s: Device is busy\n", __FUNCTION__ ));
            }
            else
            {
                result = paUnanticipatedHostError;
            }

            ENSURE_( ret, result );
        }
    }

end:
    if( pcm )
    {
        alsa_snd_pcm_close( pcm );
    }
    return result;

error:
    goto end;
}